

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O1

void embree::avx::
     BVHNIntersector1<8,_1,_false,_embree::avx::ArrayIntersector1<embree::avx::QuadMvIntersector1Moeller<4,_true>_>_>
     ::occluded(Intersectors *This,Ray *ray,RayQueryContext *context)

{
  undefined4 uVar1;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar2;
  Geometry *pGVar3;
  undefined1 auVar4 [16];
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  float fVar37;
  float fVar38;
  float fVar39;
  float fVar40;
  float fVar41;
  float fVar42;
  float fVar43;
  float fVar44;
  float fVar45;
  float fVar46;
  float fVar47;
  float fVar48;
  float fVar49;
  float fVar50;
  float fVar51;
  float fVar52;
  float fVar53;
  float fVar54;
  float fVar55;
  float fVar56;
  float fVar57;
  float fVar58;
  float fVar59;
  float fVar60;
  float fVar61;
  float fVar62;
  float fVar63;
  float fVar64;
  float fVar65;
  float fVar66;
  float fVar67;
  float fVar68;
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined4 uVar76;
  undefined1 auVar77 [32];
  undefined4 uVar78;
  undefined1 auVar79 [32];
  float fVar80;
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  bool bVar93;
  ulong uVar94;
  long lVar95;
  ulong uVar96;
  long lVar97;
  int iVar98;
  ulong uVar99;
  undefined4 uVar100;
  ulong unaff_R12;
  size_t mask;
  ulong uVar101;
  ulong uVar102;
  ulong uVar103;
  bool bVar104;
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  float fVar107;
  float fVar112;
  float fVar113;
  float fVar114;
  float fVar115;
  float fVar116;
  float fVar117;
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [32];
  undefined1 auVar124 [64];
  undefined1 auVar125 [16];
  undefined1 auVar126 [32];
  float fVar128;
  float fVar129;
  undefined1 auVar127 [64];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [32];
  undefined1 auVar133 [64];
  undefined1 auVar134 [32];
  undefined1 auVar135 [64];
  undefined1 auVar136 [32];
  undefined1 auVar137 [64];
  float fVar138;
  undefined1 auVar139 [32];
  float fVar141;
  float fVar142;
  float fVar143;
  float fVar144;
  float fVar145;
  float fVar146;
  undefined1 auVar140 [64];
  uint uVar147;
  undefined1 auVar148 [32];
  uint uVar150;
  uint uVar151;
  uint uVar152;
  uint uVar153;
  uint uVar154;
  uint uVar155;
  uint uVar156;
  undefined1 auVar149 [64];
  undefined1 auVar157 [32];
  undefined1 auVar158 [64];
  undefined1 auVar159 [32];
  float fVar160;
  float fVar162;
  float fVar163;
  float fVar164;
  float fVar165;
  float fVar166;
  float fVar167;
  undefined1 auVar161 [32];
  undefined1 auVar168 [32];
  undefined1 auVar169 [32];
  HitK<1> h;
  RTCFilterFunctionNArguments args;
  MoellerTrumboreHitM<8,_embree::avx::UVIdentity<8>_> hit;
  NodeRef stack [564];
  int local_1654;
  RTCIntersectArguments *local_1650;
  ulong local_1648;
  undefined1 local_1640 [32];
  ulong local_1618;
  ulong local_1610;
  ulong local_1608;
  ulong local_1600;
  ulong *local_15f8;
  Scene *local_15f0;
  ulong local_15e8;
  undefined1 local_15e0 [32];
  undefined1 local_15c0 [32];
  float local_15a0;
  float local_159c;
  float local_1598;
  undefined4 local_1594;
  float local_1590;
  undefined4 local_158c;
  uint local_1588;
  uint local_1584;
  uint local_1580;
  RTCFilterFunctionNArguments local_1570;
  undefined1 local_1540 [32];
  undefined1 local_1520 [32];
  undefined1 local_1500 [32];
  undefined1 local_14e0 [32];
  undefined1 local_14c0 [32];
  undefined1 local_14a0 [32];
  undefined1 local_1480 [32];
  undefined1 local_1460 [32];
  undefined1 local_1440 [32];
  undefined1 local_1420 [32];
  undefined1 local_1400 [8];
  float fStack_13f8;
  float fStack_13f4;
  float fStack_13f0;
  float fStack_13ec;
  float fStack_13e8;
  undefined4 uStack_13e4;
  undefined1 local_13e0 [32];
  undefined8 local_13c0;
  undefined8 uStack_13b8;
  undefined8 uStack_13b0;
  undefined8 uStack_13a8;
  undefined8 local_13a0;
  undefined8 uStack_1398;
  undefined8 uStack_1390;
  undefined8 uStack_1388;
  undefined1 local_1380 [32];
  undefined1 local_1360 [32];
  undefined1 local_1340 [32];
  undefined1 local_1320 [32];
  undefined1 local_12e0 [32];
  undefined1 local_12c0 [32];
  float local_12a0 [4];
  float fStack_1290;
  float fStack_128c;
  float fStack_1288;
  undefined4 uStack_1284;
  undefined1 local_1280 [32];
  float local_1260 [4];
  float fStack_1250;
  float fStack_124c;
  float fStack_1248;
  float fStack_1244;
  float local_1240 [4];
  float fStack_1230;
  float fStack_122c;
  float fStack_1228;
  float fStack_1224;
  float local_1220 [4];
  float fStack_1210;
  float fStack_120c;
  float fStack_1208;
  undefined4 uStack_1204;
  ulong local_1200;
  ulong local_11f8 [569];
  
  if (*(long *)&This->ptr[1].bounds.bounds0.lower.field_0 != 8) {
    fVar107 = ray->tfar;
    if (0.0 <= fVar107) {
      local_15f8 = local_11f8;
      aVar2 = (ray->dir).field_0;
      auVar4 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)(ray->org).field_0.m128[3]));
      auVar125._8_4_ = 0x7fffffff;
      auVar125._0_8_ = 0x7fffffff7fffffff;
      auVar125._12_4_ = 0x7fffffff;
      auVar125 = vandps_avx((undefined1  [16])aVar2,auVar125);
      auVar130._8_4_ = 0x219392ef;
      auVar130._0_8_ = 0x219392ef219392ef;
      auVar130._12_4_ = 0x219392ef;
      auVar125 = vcmpps_avx(auVar125,auVar130,1);
      auVar125 = vblendvps_avx((undefined1  [16])aVar2,auVar130,auVar125);
      auVar130 = vrcpps_avx(auVar125);
      fVar113 = auVar130._0_4_;
      auVar121._0_4_ = fVar113 * auVar125._0_4_;
      fVar114 = auVar130._4_4_;
      auVar121._4_4_ = fVar114 * auVar125._4_4_;
      fVar115 = auVar130._8_4_;
      auVar121._8_4_ = fVar115 * auVar125._8_4_;
      fVar116 = auVar130._12_4_;
      auVar121._12_4_ = fVar116 * auVar125._12_4_;
      auVar131._8_4_ = 0x3f800000;
      auVar131._0_8_ = &DAT_3f8000003f800000;
      auVar131._12_4_ = 0x3f800000;
      auVar125 = vsubps_avx(auVar131,auVar121);
      uVar100 = *(undefined4 *)&(ray->org).field_0;
      local_1440._4_4_ = uVar100;
      local_1440._0_4_ = uVar100;
      local_1440._8_4_ = uVar100;
      local_1440._12_4_ = uVar100;
      local_1440._16_4_ = uVar100;
      local_1440._20_4_ = uVar100;
      local_1440._24_4_ = uVar100;
      local_1440._28_4_ = uVar100;
      auVar135 = ZEXT3264(local_1440);
      uVar100 = *(undefined4 *)((long)&(ray->org).field_0 + 4);
      local_1460._4_4_ = uVar100;
      local_1460._0_4_ = uVar100;
      local_1460._8_4_ = uVar100;
      local_1460._12_4_ = uVar100;
      local_1460._16_4_ = uVar100;
      local_1460._20_4_ = uVar100;
      local_1460._24_4_ = uVar100;
      local_1460._28_4_ = uVar100;
      auVar137 = ZEXT3264(local_1460);
      uVar100 = *(undefined4 *)((long)&(ray->org).field_0 + 8);
      local_1480._4_4_ = uVar100;
      local_1480._0_4_ = uVar100;
      local_1480._8_4_ = uVar100;
      local_1480._12_4_ = uVar100;
      local_1480._16_4_ = uVar100;
      local_1480._20_4_ = uVar100;
      local_1480._24_4_ = uVar100;
      local_1480._28_4_ = uVar100;
      auVar140 = ZEXT3264(local_1480);
      auVar122._0_4_ = fVar113 + fVar113 * auVar125._0_4_;
      auVar122._4_4_ = fVar114 + fVar114 * auVar125._4_4_;
      auVar122._8_4_ = fVar115 + fVar115 * auVar125._8_4_;
      auVar122._12_4_ = fVar116 + fVar116 * auVar125._12_4_;
      local_1200 = *(ulong *)&This->ptr[1].bounds.bounds0.lower.field_0;
      auVar125 = vshufps_avx(auVar122,auVar122,0);
      local_14a0._16_16_ = auVar125;
      local_14a0._0_16_ = auVar125;
      auVar149 = ZEXT3264(local_14a0);
      auVar125 = vmovshdup_avx(auVar122);
      auVar130 = vshufps_avx(auVar122,auVar122,0x55);
      local_14c0._16_16_ = auVar130;
      local_14c0._0_16_ = auVar130;
      auVar158 = ZEXT3264(local_14c0);
      auVar130 = vshufpd_avx(auVar122,auVar122,1);
      auVar121 = vshufps_avx(auVar122,auVar122,0xaa);
      local_14e0._16_16_ = auVar121;
      local_14e0._0_16_ = auVar121;
      auVar124 = ZEXT3264(local_14e0);
      local_1600 = (ulong)(auVar122._0_4_ < 0.0) << 5;
      local_1608 = (ulong)(auVar125._0_4_ < 0.0) << 5 | 0x40;
      local_1610 = (ulong)(auVar130._0_4_ < 0.0) << 5 | 0x80;
      local_1618 = local_1600 ^ 0x20;
      uVar96 = local_1608 ^ 0x20;
      uVar103 = local_1610 ^ 0x20;
      auVar125 = vshufps_avx(auVar4,auVar4,0);
      local_1500._16_16_ = auVar125;
      local_1500._0_16_ = auVar125;
      auVar127 = ZEXT3264(local_1500);
      auVar125 = vshufps_avx(ZEXT416((uint)fVar107),ZEXT416((uint)fVar107),0);
      local_1520._16_16_ = auVar125;
      local_1520._0_16_ = auVar125;
      auVar133 = ZEXT3264(local_1520);
      local_1420._16_16_ = mm_lookupmask_ps._240_16_;
      local_1420._0_16_ = mm_lookupmask_ps._240_16_;
      local_13e0 = vperm2f128_avx(local_1420,mm_lookupmask_ps._0_32_,2);
      auVar105._8_4_ = 0xbf800000;
      auVar105._0_8_ = 0xbf800000bf800000;
      auVar105._12_4_ = 0xbf800000;
      auVar105._16_4_ = 0xbf800000;
      auVar105._20_4_ = 0xbf800000;
      auVar105._24_4_ = 0xbf800000;
      auVar105._28_4_ = 0xbf800000;
      auVar118._8_4_ = 0x3f800000;
      auVar118._0_8_ = &DAT_3f8000003f800000;
      auVar118._12_4_ = 0x3f800000;
      auVar118._16_4_ = 0x3f800000;
      auVar118._20_4_ = 0x3f800000;
      auVar118._24_4_ = 0x3f800000;
      auVar118._28_4_ = 0x3f800000;
      _local_1400 = vblendvps_avx(auVar118,auVar105,local_13e0);
      local_1648 = uVar103;
      do {
        if (local_15f8 == &local_1200) {
          return;
        }
        uVar102 = local_15f8[-1];
        local_15f8 = local_15f8 + -1;
        do {
          if ((uVar102 & 8) == 0) {
            auVar105 = vsubps_avx(*(undefined1 (*) [32])(uVar102 + 0x40 + local_1600),
                                  auVar135._0_32_);
            auVar69._4_4_ = auVar149._4_4_ * auVar105._4_4_;
            auVar69._0_4_ = auVar149._0_4_ * auVar105._0_4_;
            auVar69._8_4_ = auVar149._8_4_ * auVar105._8_4_;
            auVar69._12_4_ = auVar149._12_4_ * auVar105._12_4_;
            auVar69._16_4_ = auVar149._16_4_ * auVar105._16_4_;
            auVar69._20_4_ = auVar149._20_4_ * auVar105._20_4_;
            auVar69._24_4_ = auVar149._24_4_ * auVar105._24_4_;
            auVar69._28_4_ = auVar105._28_4_;
            auVar105 = vsubps_avx(*(undefined1 (*) [32])(uVar102 + 0x40 + local_1608),
                                  auVar137._0_32_);
            auVar70._4_4_ = auVar158._4_4_ * auVar105._4_4_;
            auVar70._0_4_ = auVar158._0_4_ * auVar105._0_4_;
            auVar70._8_4_ = auVar158._8_4_ * auVar105._8_4_;
            auVar70._12_4_ = auVar158._12_4_ * auVar105._12_4_;
            auVar70._16_4_ = auVar158._16_4_ * auVar105._16_4_;
            auVar70._20_4_ = auVar158._20_4_ * auVar105._20_4_;
            auVar70._24_4_ = auVar158._24_4_ * auVar105._24_4_;
            auVar70._28_4_ = auVar105._28_4_;
            auVar105 = vmaxps_avx(auVar69,auVar70);
            auVar118 = vsubps_avx(*(undefined1 (*) [32])(uVar102 + 0x40 + local_1610),
                                  auVar140._0_32_);
            auVar71._4_4_ = auVar124._4_4_ * auVar118._4_4_;
            auVar71._0_4_ = auVar124._0_4_ * auVar118._0_4_;
            auVar71._8_4_ = auVar124._8_4_ * auVar118._8_4_;
            auVar71._12_4_ = auVar124._12_4_ * auVar118._12_4_;
            auVar71._16_4_ = auVar124._16_4_ * auVar118._16_4_;
            auVar71._20_4_ = auVar124._20_4_ * auVar118._20_4_;
            auVar71._24_4_ = auVar124._24_4_ * auVar118._24_4_;
            auVar71._28_4_ = auVar118._28_4_;
            auVar118 = vmaxps_avx(auVar71,auVar127._0_32_);
            auVar105 = vmaxps_avx(auVar105,auVar118);
            auVar118 = vsubps_avx(*(undefined1 (*) [32])(uVar102 + 0x40 + local_1618),
                                  auVar135._0_32_);
            auVar72._4_4_ = auVar149._4_4_ * auVar118._4_4_;
            auVar72._0_4_ = auVar149._0_4_ * auVar118._0_4_;
            auVar72._8_4_ = auVar149._8_4_ * auVar118._8_4_;
            auVar72._12_4_ = auVar149._12_4_ * auVar118._12_4_;
            auVar72._16_4_ = auVar149._16_4_ * auVar118._16_4_;
            auVar72._20_4_ = auVar149._20_4_ * auVar118._20_4_;
            auVar72._24_4_ = auVar149._24_4_ * auVar118._24_4_;
            auVar72._28_4_ = auVar118._28_4_;
            auVar118 = vsubps_avx(*(undefined1 (*) [32])(uVar102 + 0x40 + uVar96),auVar137._0_32_);
            auVar73._4_4_ = auVar158._4_4_ * auVar118._4_4_;
            auVar73._0_4_ = auVar158._0_4_ * auVar118._0_4_;
            auVar73._8_4_ = auVar158._8_4_ * auVar118._8_4_;
            auVar73._12_4_ = auVar158._12_4_ * auVar118._12_4_;
            auVar73._16_4_ = auVar158._16_4_ * auVar118._16_4_;
            auVar73._20_4_ = auVar158._20_4_ * auVar118._20_4_;
            auVar73._24_4_ = auVar158._24_4_ * auVar118._24_4_;
            auVar73._28_4_ = auVar118._28_4_;
            auVar118 = vminps_avx(auVar72,auVar73);
            auVar69 = vsubps_avx(*(undefined1 (*) [32])(uVar102 + 0x40 + uVar103),auVar140._0_32_);
            auVar74._4_4_ = auVar124._4_4_ * auVar69._4_4_;
            auVar74._0_4_ = auVar124._0_4_ * auVar69._0_4_;
            auVar74._8_4_ = auVar124._8_4_ * auVar69._8_4_;
            auVar74._12_4_ = auVar124._12_4_ * auVar69._12_4_;
            auVar74._16_4_ = auVar124._16_4_ * auVar69._16_4_;
            auVar74._20_4_ = auVar124._20_4_ * auVar69._20_4_;
            auVar74._24_4_ = auVar124._24_4_ * auVar69._24_4_;
            auVar74._28_4_ = auVar69._28_4_;
            auVar69 = vminps_avx(auVar74,auVar133._0_32_);
            auVar118 = vminps_avx(auVar118,auVar69);
            auVar105 = vcmpps_avx(auVar105,auVar118,2);
            uVar100 = vmovmskps_avx(auVar105);
            unaff_R12 = CONCAT44((int)(unaff_R12 >> 0x20),uVar100);
          }
          if ((uVar102 & 8) == 0) {
            if (unaff_R12 == 0) {
              iVar98 = 4;
            }
            else {
              uVar101 = uVar102 & 0xfffffffffffffff0;
              lVar97 = 0;
              if (unaff_R12 != 0) {
                for (; (unaff_R12 >> lVar97 & 1) == 0; lVar97 = lVar97 + 1) {
                }
              }
              uVar102 = *(ulong *)(uVar101 + lVar97 * 8);
              uVar99 = unaff_R12 - 1 & unaff_R12;
              if (uVar99 != 0) {
                *local_15f8 = uVar102;
                lVar97 = 0;
                if (uVar99 != 0) {
                  for (; (uVar99 >> lVar97 & 1) == 0; lVar97 = lVar97 + 1) {
                  }
                }
                uVar94 = uVar99 - 1;
                while( true ) {
                  local_15f8 = local_15f8 + 1;
                  uVar102 = *(ulong *)(uVar101 + lVar97 * 8);
                  uVar94 = uVar94 & uVar99;
                  if (uVar94 == 0) break;
                  *local_15f8 = uVar102;
                  lVar97 = 0;
                  if (uVar94 != 0) {
                    for (; (uVar94 >> lVar97 & 1) == 0; lVar97 = lVar97 + 1) {
                    }
                  }
                  uVar99 = uVar94 - 1;
                }
              }
              iVar98 = 0;
            }
          }
          else {
            iVar98 = 6;
          }
        } while (iVar98 == 0);
        if (iVar98 == 6) {
          local_15e8 = (ulong)((uint)uVar102 & 0xf) - 8;
          bVar104 = local_15e8 != 0;
          if (bVar104) {
            uVar102 = uVar102 & 0xfffffffffffffff0;
            uVar103 = 0;
            do {
              lVar95 = uVar103 * 0xe0;
              lVar97 = uVar102 + 0xd0 + lVar95;
              local_13c0 = *(undefined8 *)(lVar97 + 0x10);
              uStack_13b8 = *(undefined8 *)(lVar97 + 0x18);
              lVar97 = uVar102 + 0xc0 + lVar95;
              local_13a0 = *(undefined8 *)(lVar97 + 0x10);
              uStack_1398 = *(undefined8 *)(lVar97 + 0x18);
              uStack_1390 = local_13a0;
              uStack_1388 = uStack_1398;
              uStack_13b0 = local_13c0;
              uStack_13a8 = uStack_13b8;
              auVar123._16_16_ = *(undefined1 (*) [16])(uVar102 + 0x60 + lVar95);
              auVar123._0_16_ = *(undefined1 (*) [16])(uVar102 + lVar95);
              auVar132._16_16_ = *(undefined1 (*) [16])(uVar102 + 0x70 + lVar95);
              auVar132._0_16_ = *(undefined1 (*) [16])(uVar102 + 0x10 + lVar95);
              auVar136._16_16_ = *(undefined1 (*) [16])(uVar102 + 0x80 + lVar95);
              auVar136._0_16_ = *(undefined1 (*) [16])(uVar102 + 0x20 + lVar95);
              auVar125 = *(undefined1 (*) [16])(uVar102 + 0x30 + lVar95);
              auVar106._16_16_ = auVar125;
              auVar106._0_16_ = auVar125;
              auVar4 = *(undefined1 (*) [16])(uVar102 + 0x40 + lVar95);
              auVar108._16_16_ = auVar4;
              auVar108._0_16_ = auVar4;
              auVar130 = *(undefined1 (*) [16])(uVar102 + 0x50 + lVar95);
              auVar119._16_16_ = auVar130;
              auVar119._0_16_ = auVar130;
              auVar121 = *(undefined1 (*) [16])(uVar102 + 0x90 + lVar95);
              auVar148._16_16_ = auVar121;
              auVar148._0_16_ = auVar121;
              auVar121 = *(undefined1 (*) [16])(uVar102 + 0xa0 + lVar95);
              auVar157._16_16_ = auVar121;
              auVar157._0_16_ = auVar121;
              auVar121 = *(undefined1 (*) [16])(uVar102 + 0xb0 + lVar95);
              auVar159._16_16_ = auVar121;
              auVar159._0_16_ = auVar121;
              local_15c0 = vsubps_avx(auVar123,auVar106);
              local_1640 = vsubps_avx(auVar132,auVar108);
              auVar105 = vsubps_avx(auVar136,auVar119);
              auVar118 = vsubps_avx(auVar148,auVar123);
              auVar69 = vsubps_avx(auVar157,auVar132);
              auVar70 = vsubps_avx(auVar159,auVar136);
              fVar115 = auVar70._0_4_;
              fVar160 = local_1640._0_4_;
              fVar9 = auVar70._4_4_;
              fVar162 = local_1640._4_4_;
              auVar75._4_4_ = fVar162 * fVar9;
              auVar75._0_4_ = fVar160 * fVar115;
              fVar19 = auVar70._8_4_;
              fVar163 = local_1640._8_4_;
              auVar75._8_4_ = fVar163 * fVar19;
              fVar29 = auVar70._12_4_;
              fVar164 = local_1640._12_4_;
              auVar75._12_4_ = fVar164 * fVar29;
              fVar39 = auVar70._16_4_;
              fVar165 = local_1640._16_4_;
              auVar75._16_4_ = fVar165 * fVar39;
              fVar49 = auVar70._20_4_;
              fVar166 = local_1640._20_4_;
              auVar75._20_4_ = fVar166 * fVar49;
              fVar59 = auVar70._24_4_;
              fVar167 = local_1640._24_4_;
              auVar75._24_4_ = fVar167 * fVar59;
              auVar75._28_4_ = auVar125._12_4_;
              fVar116 = auVar69._0_4_;
              fVar138 = auVar105._0_4_;
              fVar10 = auVar69._4_4_;
              fVar141 = auVar105._4_4_;
              auVar77._4_4_ = fVar141 * fVar10;
              auVar77._0_4_ = fVar138 * fVar116;
              fVar20 = auVar69._8_4_;
              fVar142 = auVar105._8_4_;
              auVar77._8_4_ = fVar142 * fVar20;
              fVar30 = auVar69._12_4_;
              fVar143 = auVar105._12_4_;
              auVar77._12_4_ = fVar143 * fVar30;
              fVar40 = auVar69._16_4_;
              fVar144 = auVar105._16_4_;
              auVar77._16_4_ = fVar144 * fVar40;
              fVar50 = auVar69._20_4_;
              fVar145 = auVar105._20_4_;
              auVar77._20_4_ = fVar145 * fVar50;
              fVar60 = auVar69._24_4_;
              uVar76 = auVar4._12_4_;
              fVar146 = auVar105._24_4_;
              auVar77._24_4_ = fVar146 * fVar60;
              auVar77._28_4_ = uVar76;
              local_1540 = vsubps_avx(auVar77,auVar75);
              fVar117 = auVar118._0_4_;
              fVar11 = auVar118._4_4_;
              auVar79._4_4_ = fVar141 * fVar11;
              auVar79._0_4_ = fVar138 * fVar117;
              fVar21 = auVar118._8_4_;
              auVar79._8_4_ = fVar142 * fVar21;
              fVar31 = auVar118._12_4_;
              auVar79._12_4_ = fVar143 * fVar31;
              fVar41 = auVar118._16_4_;
              auVar79._16_4_ = fVar144 * fVar41;
              fVar51 = auVar118._20_4_;
              auVar79._20_4_ = fVar145 * fVar51;
              fVar61 = auVar118._24_4_;
              uVar78 = local_1540._28_4_;
              auVar79._24_4_ = fVar146 * fVar61;
              auVar79._28_4_ = uVar78;
              fVar128 = local_15c0._0_4_;
              fVar12 = local_15c0._4_4_;
              auVar81._4_4_ = fVar9 * fVar12;
              auVar81._0_4_ = fVar115 * fVar128;
              fVar22 = local_15c0._8_4_;
              auVar81._8_4_ = fVar19 * fVar22;
              fVar32 = local_15c0._12_4_;
              auVar81._12_4_ = fVar29 * fVar32;
              fVar42 = local_15c0._16_4_;
              auVar81._16_4_ = fVar39 * fVar42;
              fVar52 = local_15c0._20_4_;
              auVar81._20_4_ = fVar49 * fVar52;
              fVar62 = local_15c0._24_4_;
              fVar80 = auVar130._12_4_;
              auVar81._24_4_ = fVar59 * fVar62;
              auVar81._28_4_ = fVar80;
              auVar105 = vsubps_avx(auVar81,auVar79);
              auVar82._4_4_ = fVar10 * fVar12;
              auVar82._0_4_ = fVar116 * fVar128;
              auVar82._8_4_ = fVar20 * fVar22;
              auVar82._12_4_ = fVar30 * fVar32;
              auVar82._16_4_ = fVar40 * fVar42;
              auVar82._20_4_ = fVar50 * fVar52;
              auVar82._24_4_ = fVar60 * fVar62;
              auVar82._28_4_ = uVar78;
              auVar83._4_4_ = fVar162 * fVar11;
              auVar83._0_4_ = fVar160 * fVar117;
              auVar83._8_4_ = fVar163 * fVar21;
              auVar83._12_4_ = fVar164 * fVar31;
              auVar83._16_4_ = fVar165 * fVar41;
              auVar83._20_4_ = fVar166 * fVar51;
              auVar83._24_4_ = fVar167 * fVar61;
              auVar83._28_4_ = local_1640._28_4_;
              local_15e0 = vsubps_avx(auVar83,auVar82);
              uVar100 = *(undefined4 *)&(ray->org).field_0;
              auVar161._4_4_ = uVar100;
              auVar161._0_4_ = uVar100;
              auVar161._8_4_ = uVar100;
              auVar161._12_4_ = uVar100;
              auVar161._16_4_ = uVar100;
              auVar161._20_4_ = uVar100;
              auVar161._24_4_ = uVar100;
              auVar161._28_4_ = uVar100;
              uVar100 = *(undefined4 *)((long)&(ray->org).field_0 + 4);
              auVar168._4_4_ = uVar100;
              auVar168._0_4_ = uVar100;
              auVar168._8_4_ = uVar100;
              auVar168._12_4_ = uVar100;
              auVar168._16_4_ = uVar100;
              auVar168._20_4_ = uVar100;
              auVar168._24_4_ = uVar100;
              auVar168._28_4_ = uVar100;
              uVar1 = *(undefined4 *)((long)&(ray->org).field_0 + 8);
              auVar169._4_4_ = uVar1;
              auVar169._0_4_ = uVar1;
              auVar169._8_4_ = uVar1;
              auVar169._12_4_ = uVar1;
              auVar169._16_4_ = uVar1;
              auVar169._20_4_ = uVar1;
              auVar169._24_4_ = uVar1;
              auVar169._28_4_ = uVar1;
              fVar107 = (ray->dir).field_0.m128[1];
              auVar71 = vsubps_avx(auVar123,auVar161);
              fVar113 = (ray->dir).field_0.m128[2];
              auVar72 = vsubps_avx(auVar132,auVar168);
              auVar73 = vsubps_avx(auVar136,auVar169);
              fVar129 = auVar73._0_4_;
              fVar13 = auVar73._4_4_;
              auVar84._4_4_ = fVar107 * fVar13;
              auVar84._0_4_ = fVar107 * fVar129;
              fVar23 = auVar73._8_4_;
              auVar84._8_4_ = fVar107 * fVar23;
              fVar33 = auVar73._12_4_;
              auVar84._12_4_ = fVar107 * fVar33;
              fVar43 = auVar73._16_4_;
              auVar84._16_4_ = fVar107 * fVar43;
              fVar53 = auVar73._20_4_;
              auVar84._20_4_ = fVar107 * fVar53;
              fVar63 = auVar73._24_4_;
              auVar84._24_4_ = fVar107 * fVar63;
              auVar84._28_4_ = uVar100;
              fVar112 = auVar72._0_4_;
              fVar14 = auVar72._4_4_;
              auVar85._4_4_ = fVar113 * fVar14;
              auVar85._0_4_ = fVar113 * fVar112;
              fVar24 = auVar72._8_4_;
              auVar85._8_4_ = fVar113 * fVar24;
              fVar34 = auVar72._12_4_;
              auVar85._12_4_ = fVar113 * fVar34;
              fVar44 = auVar72._16_4_;
              auVar85._16_4_ = fVar113 * fVar44;
              fVar54 = auVar72._20_4_;
              auVar85._20_4_ = fVar113 * fVar54;
              fVar64 = auVar72._24_4_;
              auVar85._24_4_ = fVar113 * fVar64;
              auVar85._28_4_ = uVar1;
              auVar72 = vsubps_avx(auVar85,auVar84);
              fVar114 = (ray->dir).field_0.m128[0];
              fVar5 = auVar71._0_4_;
              fVar15 = auVar71._4_4_;
              auVar86._4_4_ = fVar113 * fVar15;
              auVar86._0_4_ = fVar113 * fVar5;
              fVar25 = auVar71._8_4_;
              auVar86._8_4_ = fVar113 * fVar25;
              fVar35 = auVar71._12_4_;
              auVar86._12_4_ = fVar113 * fVar35;
              fVar45 = auVar71._16_4_;
              auVar86._16_4_ = fVar113 * fVar45;
              fVar55 = auVar71._20_4_;
              auVar86._20_4_ = fVar113 * fVar55;
              fVar65 = auVar71._24_4_;
              auVar86._24_4_ = fVar113 * fVar65;
              auVar86._28_4_ = uVar78;
              auVar87._4_4_ = fVar114 * fVar13;
              auVar87._0_4_ = fVar114 * fVar129;
              auVar87._8_4_ = fVar114 * fVar23;
              auVar87._12_4_ = fVar114 * fVar33;
              auVar87._16_4_ = fVar114 * fVar43;
              auVar87._20_4_ = fVar114 * fVar53;
              auVar87._24_4_ = fVar114 * fVar63;
              auVar87._28_4_ = uVar76;
              auVar71 = vsubps_avx(auVar87,auVar86);
              auVar88._4_4_ = fVar114 * fVar14;
              auVar88._0_4_ = fVar114 * fVar112;
              auVar88._8_4_ = fVar114 * fVar24;
              auVar88._12_4_ = fVar114 * fVar34;
              auVar88._16_4_ = fVar114 * fVar44;
              auVar88._20_4_ = fVar114 * fVar54;
              auVar88._24_4_ = fVar114 * fVar64;
              auVar88._28_4_ = uVar76;
              auVar89._4_4_ = fVar107 * fVar15;
              auVar89._0_4_ = fVar107 * fVar5;
              auVar89._8_4_ = fVar107 * fVar25;
              auVar89._12_4_ = fVar107 * fVar35;
              auVar89._16_4_ = fVar107 * fVar45;
              auVar89._20_4_ = fVar107 * fVar55;
              auVar89._24_4_ = fVar107 * fVar65;
              auVar89._28_4_ = fVar80;
              auVar73 = vsubps_avx(auVar89,auVar88);
              fVar6 = local_15e0._0_4_;
              fVar16 = local_15e0._4_4_;
              fVar26 = local_15e0._8_4_;
              fVar36 = local_15e0._12_4_;
              fVar46 = local_15e0._16_4_;
              fVar56 = local_15e0._20_4_;
              fVar66 = local_15e0._24_4_;
              fVar7 = auVar105._0_4_;
              fVar17 = auVar105._4_4_;
              fVar27 = auVar105._8_4_;
              fVar37 = auVar105._12_4_;
              fVar47 = auVar105._16_4_;
              fVar57 = auVar105._20_4_;
              fVar67 = auVar105._24_4_;
              fVar8 = local_1540._0_4_;
              fVar18 = local_1540._4_4_;
              fVar28 = local_1540._8_4_;
              fVar38 = local_1540._12_4_;
              fVar48 = local_1540._16_4_;
              fVar58 = local_1540._20_4_;
              fVar68 = local_1540._24_4_;
              auVar120._0_4_ = fVar114 * fVar8 + fVar107 * fVar7 + fVar113 * fVar6;
              auVar120._4_4_ = fVar114 * fVar18 + fVar107 * fVar17 + fVar113 * fVar16;
              auVar120._8_4_ = fVar114 * fVar28 + fVar107 * fVar27 + fVar113 * fVar26;
              auVar120._12_4_ = fVar114 * fVar38 + fVar107 * fVar37 + fVar113 * fVar36;
              auVar120._16_4_ = fVar114 * fVar48 + fVar107 * fVar47 + fVar113 * fVar46;
              auVar120._20_4_ = fVar114 * fVar58 + fVar107 * fVar57 + fVar113 * fVar56;
              auVar120._24_4_ = fVar114 * fVar68 + fVar107 * fVar67 + fVar113 * fVar66;
              auVar120._28_4_ = fVar113 + fVar113 + fVar80;
              auVar109._8_4_ = 0x80000000;
              auVar109._0_8_ = 0x8000000080000000;
              auVar109._12_4_ = 0x80000000;
              auVar109._16_4_ = 0x80000000;
              auVar109._20_4_ = 0x80000000;
              auVar109._24_4_ = 0x80000000;
              auVar109._28_4_ = 0x80000000;
              auVar105 = vandps_avx(auVar120,auVar109);
              uVar147 = auVar105._0_4_;
              auVar134._0_4_ =
                   (float)(uVar147 ^
                          (uint)(fVar117 * auVar72._0_4_ +
                                fVar116 * auVar71._0_4_ + fVar115 * auVar73._0_4_));
              uVar150 = auVar105._4_4_;
              auVar134._4_4_ =
                   (float)(uVar150 ^
                          (uint)(fVar11 * auVar72._4_4_ +
                                fVar10 * auVar71._4_4_ + fVar9 * auVar73._4_4_));
              uVar151 = auVar105._8_4_;
              auVar134._8_4_ =
                   (float)(uVar151 ^
                          (uint)(fVar21 * auVar72._8_4_ +
                                fVar20 * auVar71._8_4_ + fVar19 * auVar73._8_4_));
              uVar152 = auVar105._12_4_;
              auVar134._12_4_ =
                   (float)(uVar152 ^
                          (uint)(fVar31 * auVar72._12_4_ +
                                fVar30 * auVar71._12_4_ + fVar29 * auVar73._12_4_));
              uVar153 = auVar105._16_4_;
              auVar134._16_4_ =
                   (float)(uVar153 ^
                          (uint)(fVar41 * auVar72._16_4_ +
                                fVar40 * auVar71._16_4_ + fVar39 * auVar73._16_4_));
              uVar154 = auVar105._20_4_;
              auVar134._20_4_ =
                   (float)(uVar154 ^
                          (uint)(fVar51 * auVar72._20_4_ +
                                fVar50 * auVar71._20_4_ + fVar49 * auVar73._20_4_));
              uVar155 = auVar105._24_4_;
              auVar134._24_4_ =
                   (float)(uVar155 ^
                          (uint)(fVar61 * auVar72._24_4_ +
                                fVar60 * auVar71._24_4_ + fVar59 * auVar73._24_4_));
              uVar156 = auVar105._28_4_;
              auVar134._28_4_ =
                   (float)(uVar156 ^ (uint)(auVar118._28_4_ + auVar69._28_4_ + auVar70._28_4_));
              auVar139._0_4_ =
                   (float)(uVar147 ^
                          (uint)(auVar72._0_4_ * fVar128 +
                                auVar71._0_4_ * fVar160 + fVar138 * auVar73._0_4_));
              auVar139._4_4_ =
                   (float)(uVar150 ^
                          (uint)(auVar72._4_4_ * fVar12 +
                                auVar71._4_4_ * fVar162 + fVar141 * auVar73._4_4_));
              auVar139._8_4_ =
                   (float)(uVar151 ^
                          (uint)(auVar72._8_4_ * fVar22 +
                                auVar71._8_4_ * fVar163 + fVar142 * auVar73._8_4_));
              auVar139._12_4_ =
                   (float)(uVar152 ^
                          (uint)(auVar72._12_4_ * fVar32 +
                                auVar71._12_4_ * fVar164 + fVar143 * auVar73._12_4_));
              auVar139._16_4_ =
                   (float)(uVar153 ^
                          (uint)(auVar72._16_4_ * fVar42 +
                                auVar71._16_4_ * fVar165 + fVar144 * auVar73._16_4_));
              auVar139._20_4_ =
                   (float)(uVar154 ^
                          (uint)(auVar72._20_4_ * fVar52 +
                                auVar71._20_4_ * fVar166 + fVar145 * auVar73._20_4_));
              auVar139._24_4_ =
                   (float)(uVar155 ^
                          (uint)(auVar72._24_4_ * fVar62 +
                                auVar71._24_4_ * fVar167 + fVar146 * auVar73._24_4_));
              auVar139._28_4_ = (float)(uVar156 ^ (uint)(auVar71._28_4_ + auVar73._28_4_ + -0.0));
              auVar118 = ZEXT1232(ZEXT412(0)) << 0x20;
              auVar105 = vcmpps_avx(auVar134,auVar118,5);
              auVar118 = vcmpps_avx(auVar139,auVar118,5);
              auVar105 = vandps_avx(auVar105,auVar118);
              auVar110._8_4_ = 0x7fffffff;
              auVar110._0_8_ = 0x7fffffff7fffffff;
              auVar110._12_4_ = 0x7fffffff;
              auVar110._16_4_ = 0x7fffffff;
              auVar110._20_4_ = 0x7fffffff;
              auVar110._24_4_ = 0x7fffffff;
              auVar110._28_4_ = 0x7fffffff;
              local_1320 = vandps_avx(auVar120,auVar110);
              auVar118 = vcmpps_avx(ZEXT1232(ZEXT412(0)) << 0x20,auVar120,4);
              auVar105 = vandps_avx(auVar105,auVar118);
              auVar111._0_4_ = auVar139._0_4_ + auVar134._0_4_;
              auVar111._4_4_ = auVar139._4_4_ + auVar134._4_4_;
              auVar111._8_4_ = auVar139._8_4_ + auVar134._8_4_;
              auVar111._12_4_ = auVar139._12_4_ + auVar134._12_4_;
              auVar111._16_4_ = auVar139._16_4_ + auVar134._16_4_;
              auVar111._20_4_ = auVar139._20_4_ + auVar134._20_4_;
              auVar111._24_4_ = auVar139._24_4_ + auVar134._24_4_;
              auVar111._28_4_ = auVar139._28_4_ + auVar134._28_4_;
              auVar69 = vcmpps_avx(auVar111,local_1320,2);
              auVar118 = vandps_avx(auVar105,auVar69);
              auVar70 = local_1420 & auVar118;
              if ((((((((auVar70 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar70 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar70 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar70 >> 0x7f,0) != '\0') ||
                    (auVar70 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar70 >> 0xbf,0) != '\0') ||
                  (auVar70 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar70[0x1f] < '\0') {
                auVar118 = vandps_avx(auVar118,local_1420);
                local_1340._0_4_ =
                     (float)(uVar147 ^ (uint)(fVar8 * fVar5 + fVar7 * fVar112 + fVar129 * fVar6));
                local_1340._4_4_ =
                     (float)(uVar150 ^ (uint)(fVar18 * fVar15 + fVar17 * fVar14 + fVar13 * fVar16));
                local_1340._8_4_ =
                     (float)(uVar151 ^ (uint)(fVar28 * fVar25 + fVar27 * fVar24 + fVar23 * fVar26));
                local_1340._12_4_ =
                     (float)(uVar152 ^ (uint)(fVar38 * fVar35 + fVar37 * fVar34 + fVar33 * fVar36));
                local_1340._16_4_ =
                     (float)(uVar153 ^ (uint)(fVar48 * fVar45 + fVar47 * fVar44 + fVar43 * fVar46));
                local_1340._20_4_ =
                     (float)(uVar154 ^ (uint)(fVar58 * fVar55 + fVar57 * fVar54 + fVar53 * fVar56));
                local_1340._24_4_ =
                     (float)(uVar155 ^ (uint)(fVar68 * fVar65 + fVar67 * fVar64 + fVar63 * fVar66));
                local_1340._28_4_ =
                     uVar156 ^ (uint)(auVar69._28_4_ + auVar69._28_4_ + auVar105._28_4_);
                fVar107 = (ray->org).field_0.m128[3];
                fVar113 = local_1320._0_4_;
                fVar114 = local_1320._4_4_;
                auVar90._4_4_ = fVar114 * fVar107;
                auVar90._0_4_ = fVar113 * fVar107;
                fVar115 = local_1320._8_4_;
                auVar90._8_4_ = fVar115 * fVar107;
                fVar116 = local_1320._12_4_;
                auVar90._12_4_ = fVar116 * fVar107;
                fVar117 = local_1320._16_4_;
                auVar90._16_4_ = fVar117 * fVar107;
                fVar128 = local_1320._20_4_;
                auVar90._20_4_ = fVar128 * fVar107;
                fVar129 = local_1320._24_4_;
                auVar90._24_4_ = fVar129 * fVar107;
                auVar90._28_4_ = fVar107;
                auVar105 = vcmpps_avx(auVar90,local_1340,1);
                fVar107 = ray->tfar;
                auVar91._4_4_ = fVar114 * fVar107;
                auVar91._0_4_ = fVar113 * fVar107;
                auVar91._8_4_ = fVar115 * fVar107;
                auVar91._12_4_ = fVar116 * fVar107;
                auVar91._16_4_ = fVar117 * fVar107;
                auVar91._20_4_ = fVar128 * fVar107;
                auVar91._24_4_ = fVar129 * fVar107;
                auVar91._28_4_ = fVar107;
                auVar69 = vcmpps_avx(local_1340,auVar91,2);
                auVar105 = vandps_avx(auVar69,auVar105);
                auVar69 = auVar118 & auVar105;
                if ((((((((auVar69 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                         (auVar69 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        (auVar69 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                       SUB321(auVar69 >> 0x7f,0) != '\0') ||
                      (auVar69 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                     SUB321(auVar69 >> 0xbf,0) != '\0') ||
                    (auVar69 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                    auVar69[0x1f] < '\0') {
                  local_12e0 = vandps_avx(auVar118,auVar105);
                  auVar105 = vsubps_avx(local_1320,auVar139);
                  local_1380 = vblendvps_avx(auVar134,auVar105,local_13e0);
                  auVar105 = vsubps_avx(local_1320,auVar134);
                  local_1360 = vblendvps_avx(auVar139,auVar105,local_13e0);
                  local_1260[0] = fVar8 * (float)local_1400._0_4_;
                  local_1260[1] = fVar18 * (float)local_1400._4_4_;
                  local_1260[2] = fVar28 * fStack_13f8;
                  local_1260[3] = fVar38 * fStack_13f4;
                  fStack_1250 = fVar48 * fStack_13f0;
                  fStack_124c = fVar58 * fStack_13ec;
                  fStack_1248 = fVar68 * fStack_13e8;
                  fStack_1244 = auVar139._28_4_;
                  local_1240[0] = fVar7 * (float)local_1400._0_4_;
                  local_1240[1] = fVar17 * (float)local_1400._4_4_;
                  local_1240[2] = fVar27 * fStack_13f8;
                  local_1240[3] = fVar37 * fStack_13f4;
                  fStack_1230 = fVar47 * fStack_13f0;
                  fStack_122c = fVar57 * fStack_13ec;
                  fStack_1228 = fVar67 * fStack_13e8;
                  fStack_1224 = auVar139._28_4_;
                  auVar105 = vrcpps_avx(local_1320);
                  local_1220[0] = (float)local_1400._0_4_ * fVar6;
                  local_1220[1] = (float)local_1400._4_4_ * fVar16;
                  local_1220[2] = fStack_13f8 * fVar26;
                  local_1220[3] = fStack_13f4 * fVar36;
                  fStack_1210 = fStack_13f0 * fVar46;
                  fStack_120c = fStack_13ec * fVar56;
                  fStack_1208 = fStack_13e8 * fVar66;
                  uStack_1204 = uStack_13e4;
                  fVar107 = auVar105._0_4_;
                  fVar112 = auVar105._4_4_;
                  auVar92._4_4_ = fVar114 * fVar112;
                  auVar92._0_4_ = fVar113 * fVar107;
                  fVar113 = auVar105._8_4_;
                  auVar92._8_4_ = fVar115 * fVar113;
                  fVar114 = auVar105._12_4_;
                  auVar92._12_4_ = fVar116 * fVar114;
                  fVar115 = auVar105._16_4_;
                  auVar92._16_4_ = fVar117 * fVar115;
                  fVar116 = auVar105._20_4_;
                  auVar92._20_4_ = fVar128 * fVar116;
                  fVar117 = auVar105._24_4_;
                  auVar92._24_4_ = fVar129 * fVar117;
                  auVar92._28_4_ = uStack_13e4;
                  auVar126._8_4_ = 0x3f800000;
                  auVar126._0_8_ = &DAT_3f8000003f800000;
                  auVar126._12_4_ = 0x3f800000;
                  auVar126._16_4_ = 0x3f800000;
                  auVar126._20_4_ = 0x3f800000;
                  auVar126._24_4_ = 0x3f800000;
                  auVar126._28_4_ = 0x3f800000;
                  auVar105 = vsubps_avx(auVar126,auVar92);
                  fVar107 = fVar107 + fVar107 * auVar105._0_4_;
                  fVar112 = fVar112 + fVar112 * auVar105._4_4_;
                  fVar113 = fVar113 + fVar113 * auVar105._8_4_;
                  fVar114 = fVar114 + fVar114 * auVar105._12_4_;
                  fVar115 = fVar115 + fVar115 * auVar105._16_4_;
                  fVar116 = fVar116 + fVar116 * auVar105._20_4_;
                  fVar117 = fVar117 + fVar117 * auVar105._24_4_;
                  local_1280._4_4_ = fVar112 * local_1340._4_4_;
                  local_1280._0_4_ = fVar107 * local_1340._0_4_;
                  local_1280._8_4_ = fVar113 * local_1340._8_4_;
                  local_1280._12_4_ = fVar114 * local_1340._12_4_;
                  local_1280._16_4_ = fVar115 * local_1340._16_4_;
                  local_1280._20_4_ = fVar116 * local_1340._20_4_;
                  local_1280._24_4_ = fVar117 * local_1340._24_4_;
                  local_1280._28_4_ = auVar105._28_4_;
                  local_15f0 = context->scene;
                  local_12c0._4_4_ = local_1380._4_4_ * fVar112;
                  local_12c0._0_4_ = local_1380._0_4_ * fVar107;
                  local_12c0._8_4_ = local_1380._8_4_ * fVar113;
                  local_12c0._12_4_ = local_1380._12_4_ * fVar114;
                  local_12c0._16_4_ = local_1380._16_4_ * fVar115;
                  local_12c0._20_4_ = local_1380._20_4_ * fVar116;
                  local_12c0._24_4_ = local_1380._24_4_ * fVar117;
                  local_12c0._28_4_ = local_1380._28_4_;
                  local_12a0[0] = local_1360._0_4_ * fVar107;
                  local_12a0[1] = local_1360._4_4_ * fVar112;
                  local_12a0[2] = local_1360._8_4_ * fVar113;
                  local_12a0[3] = local_1360._12_4_ * fVar114;
                  fStack_1290 = local_1360._16_4_ * fVar115;
                  fStack_128c = local_1360._20_4_ * fVar116;
                  fStack_1288 = local_1360._24_4_ * fVar117;
                  uStack_1284 = local_1360._28_4_;
                  uVar100 = vmovmskps_avx(local_12e0);
                  uVar101 = CONCAT44((int)((ulong)local_15f0 >> 0x20),uVar100);
                  do {
                    local_1640._0_8_ = uVar101;
                    uVar99 = 0;
                    if (uVar101 != 0) {
                      for (; (uVar101 >> uVar99 & 1) == 0; uVar99 = uVar99 + 1) {
                      }
                    }
                    local_15e0._0_8_ = uVar99;
                    local_1588 = *(uint *)((long)&local_13a0 + uVar99 * 4);
                    pGVar3 = (local_15f0->geometries).items[local_1588].ptr;
                    local_1540._0_8_ = pGVar3;
                    if ((pGVar3->mask & ray->mask) == 0) {
                      local_1640._0_8_ = uVar101 ^ 1L << (uVar99 & 0x3f);
                      bVar93 = true;
                    }
                    else {
                      local_1650 = context->args;
                      if ((local_1650->filter == (RTCFilterFunctionN)0x0) &&
                         (pGVar3->occlusionFilterN == (RTCFilterFunctionN)0x0)) {
                        bVar93 = false;
                      }
                      else {
                        local_1594 = *(undefined4 *)(local_12c0 + uVar99 * 4);
                        local_1590 = local_12a0[uVar99];
                        local_15c0._0_8_ = context;
                        local_1570.context = context->user;
                        local_158c = *(undefined4 *)((long)&local_13c0 + uVar99 * 4);
                        local_15a0 = local_1260[uVar99];
                        local_159c = local_1240[uVar99];
                        local_1598 = local_1220[uVar99];
                        local_1584 = (local_1570.context)->instID[0];
                        local_1580 = (local_1570.context)->instPrimID[0];
                        fVar107 = ray->tfar;
                        ray->tfar = *(float *)(local_1280 + uVar99 * 4);
                        local_1654 = -1;
                        local_1570.valid = &local_1654;
                        local_1570.geometryUserPtr = pGVar3->userPtr;
                        local_1570.hit = (RTCHitN *)&local_15a0;
                        local_1570.N = 1;
                        local_1570.ray = (RTCRayN *)ray;
                        if ((pGVar3->occlusionFilterN == (RTCFilterFunctionN)0x0) ||
                           ((*pGVar3->occlusionFilterN)(&local_1570), *local_1570.valid != 0)) {
                          if (local_1650->filter != (RTCFilterFunctionN)0x0) {
                            if (((local_1650->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                                 RTC_RAY_QUERY_FLAG_INCOHERENT) ||
                               ((*(byte *)(local_1540._0_8_ + 0x3e) & 0x40) != 0)) {
                              (*local_1650->filter)(&local_1570);
                            }
                            if (*local_1570.valid == 0) goto LAB_0030aa9e;
                          }
                          bVar93 = false;
                        }
                        else {
LAB_0030aa9e:
                          ray->tfar = fVar107;
                          local_1640._0_8_ = local_1640._0_8_ ^ 1L << (local_15e0._0_8_ & 0x3f);
                          bVar93 = true;
                        }
                        context = (RayQueryContext *)local_15c0._0_8_;
                      }
                    }
                    iVar98 = 0;
                    if (!bVar93) {
                      auVar135 = ZEXT3264(local_1440);
                      auVar137 = ZEXT3264(local_1460);
                      auVar140 = ZEXT3264(local_1480);
                      auVar149 = ZEXT3264(local_14a0);
                      auVar158 = ZEXT3264(local_14c0);
                      auVar124 = ZEXT3264(local_14e0);
                      auVar127 = ZEXT3264(local_1500);
                      auVar133 = ZEXT3264(local_1520);
                      uVar103 = local_1648;
                      if (bVar104) {
                        ray->tfar = -INFINITY;
                        iVar98 = 3;
                      }
                      goto LAB_0030ab4a;
                    }
                    uVar101 = local_1640._0_8_;
                  } while (local_1640._0_8_ != 0);
                }
              }
              uVar103 = uVar103 + 1;
              bVar104 = uVar103 < local_15e8;
            } while (uVar103 != local_15e8);
            auVar135 = ZEXT3264(local_1440);
            auVar137 = ZEXT3264(local_1460);
            auVar140 = ZEXT3264(local_1480);
            auVar149 = ZEXT3264(local_14a0);
            auVar158 = ZEXT3264(local_14c0);
            auVar124 = ZEXT3264(local_14e0);
            auVar127 = ZEXT3264(local_1500);
            auVar133 = ZEXT3264(local_1520);
            uVar103 = local_1648;
          }
          iVar98 = 0;
        }
LAB_0030ab4a:
      } while (iVar98 != 3);
    }
  }
  return;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::occluded(const Accel::Intersectors* __restrict__ This,
                                                                             Ray& __restrict__ ray,
                                                                             RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
       
      /* early out for already occluded rays */
      if (unlikely(ray.tfar < 0.0f))
        return;

      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      NodeRef stack[stackSize];    // stack of nodes that still need to get traversed
      NodeRef* stackPtr = stack+1; // current stack pointer
      NodeRef* stackEnd = stack+stackSize;
      stack[0] = bvh->root;

      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif

      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = (NodeRef)*stackPtr;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(shadow.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(shadow.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        if (PrimitiveIntersector1::occluded(This, pre, ray, context, prim, num, tray, lazy_node)) {
          ray.tfar = neg_inf;
          break;
        }

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          *stackPtr = (NodeRef)lazy_node;
          stackPtr++;
        }
      }
    }